

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O3

bool __thiscall PSEngine::next_subturn(PSEngine *this)

{
  vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_> *__x;
  element_type *peVar1;
  pointer pRVar2;
  long *plVar3;
  pointer pCVar4;
  pointer pMVar5;
  pointer pRVar6;
  Level last_subturn_save;
  undefined1 local_1e8 [32];
  pointer local_1c8;
  long local_1c0;
  undefined1 local_1b8 [16];
  Pattern *local_1a8 [2];
  Pattern local_198;
  long local_180;
  pointer local_178;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  pointer local_168 [2];
  pointer local_158 [2];
  ObjectCache *local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  long local_130 [2];
  pointer local_120 [2];
  undefined1 local_110 [16];
  pointer local_100 [2];
  undefined1 local_f0 [16];
  long *local_e0 [2];
  long local_d0 [2];
  long *local_c0 [2];
  long local_b0 [2];
  string local_a0;
  undefined8 local_80;
  int local_78;
  vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_> local_70;
  Level local_58;
  
  if ((int)(this->m_config).log_verbosity < 3) {
    peVar1 = (this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_c0[0] = local_b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c0,m_engine_log_cat_abi_cxx11_._M_dataplus._M_p,
               m_engine_log_cat_abi_cxx11_._M_dataplus._M_p +
               m_engine_log_cat_abi_cxx11_._M_string_length);
    local_e0[0] = local_d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"--- Subturn start ---","");
    (*peVar1->_vptr_PSLogger[2])(peVar1,2,local_c0,local_e0);
    if (local_e0[0] != local_d0) {
      operator_delete(local_e0[0],local_d0[0] + 1);
    }
    if (local_c0[0] != local_b0) {
      operator_delete(local_c0[0],local_b0[0] + 1);
    }
  }
  local_78 = (this->m_current_level).size.y;
  local_80._0_4_ = (this->m_current_level).level_idx;
  local_80._4_4_ = (this->m_current_level).size.x;
  __x = &(this->m_current_level).cells;
  std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::vector(&local_70,__x);
  local_1e8._0_8_ = (pointer)0x0;
  local_1e8._8_8_ = (pointer)0x0;
  local_1e8._16_8_ = (pointer)0x0;
  std::vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>::
  emplace_back<PSEngine::SubturnHistory>
            (&(this->m_turn_history).subturns,(SubturnHistory *)local_1e8);
  std::vector<PSEngine::RuleDelta,_std::allocator<PSEngine::RuleDelta>_>::~vector
            ((vector<PSEngine::RuleDelta,_std::allocator<PSEngine::RuleDelta>_> *)local_1e8);
  local_58.level_idx = (this->m_current_level).level_idx;
  local_58.size.x = (this->m_current_level).size.x;
  local_58.size.y = (this->m_current_level).size.y;
  std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::vector(&local_58.cells,__x);
  local_148 = &this->m_object_cache;
  ObjectCache::build_cache(local_148,&local_58);
  std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::~vector(&local_58.cells);
  pRVar6 = (this->m_compiled_game).rules.
           super__Vector_base<CompiledGame::Rule,_std::allocator<CompiledGame::Rule>_>._M_impl.
           super__Vector_impl_data._M_start;
  pRVar2 = (this->m_compiled_game).rules.
           super__Vector_base<CompiledGame::Rule,_std::allocator<CompiledGame::Rule>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pRVar6 != pRVar2) {
    do {
      if ((int)(this->m_config).log_verbosity < 3) {
        peVar1 = (this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_168[0] = (pointer)local_158;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_168,m_engine_log_cat_abi_cxx11_._M_dataplus._M_p,
                   m_engine_log_cat_abi_cxx11_._M_dataplus._M_p +
                   m_engine_log_cat_abi_cxx11_._M_string_length);
        CompiledGame::Rule::to_string_abi_cxx11_((string *)local_1e8,pRVar6,false);
        plVar3 = (long *)std::__cxx11::string::replace((ulong)local_1e8,0,(char *)0x0,0x14ba16);
        pCVar4 = (pointer)(plVar3 + 2);
        if ((pointer)*plVar3 == pCVar4) {
          local_178 = *(pointer *)pCVar4;
          uStack_170 = (undefined4)plVar3[3];
          uStack_16c = *(undefined4 *)((long)plVar3 + 0x1c);
          local_198.cells.
          super__Vector_base<CompiledGame::CellRule,_std::allocator<CompiledGame::CellRule>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&local_178;
        }
        else {
          local_178 = *(pointer *)pCVar4;
          local_198.cells.
          super__Vector_base<CompiledGame::CellRule,_std::allocator<CompiledGame::CellRule>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar3;
        }
        local_180 = plVar3[1];
        *plVar3 = (long)pCVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        (*peVar1->_vptr_PSLogger[2])
                  (peVar1,2,local_168,
                   &local_198.cells.
                    super__Vector_base<CompiledGame::CellRule,_std::allocator<CompiledGame::CellRule>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (local_198.cells.
            super__Vector_base<CompiledGame::CellRule,_std::allocator<CompiledGame::CellRule>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&local_178) {
          operator_delete(local_198.cells.
                          super__Vector_base<CompiledGame::CellRule,_std::allocator<CompiledGame::CellRule>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (ulong)((long)&local_178->type + 1));
        }
        if ((pointer)local_1e8._0_8_ != (pointer)(local_1e8 + 0x10)) {
          operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
        }
        if (local_168[0] != (pointer)local_158) {
          operator_delete(local_168[0],(ulong)((long)&local_158[0]->pattern_index + 1));
        }
      }
      apply_rule(this,pRVar6);
      pRVar6 = pRVar6 + 1;
    } while (pRVar6 != pRVar2);
  }
  advanced_movement_resolution(this);
  if ((int)(this->m_config).log_verbosity < 3) {
    peVar1 = (this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_100[0] = (pointer)local_f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_100,m_engine_log_cat_abi_cxx11_._M_dataplus._M_p,
               m_engine_log_cat_abi_cxx11_._M_dataplus._M_p +
               m_engine_log_cat_abi_cxx11_._M_string_length);
    local_120[0] = (pointer)local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"movement resolved","");
    (*peVar1->_vptr_PSLogger[2])(peVar1,2,local_100,local_120);
    if (local_120[0] != (pointer)local_110) {
      operator_delete(local_120[0],local_110._0_8_ + 1);
    }
    if (local_100[0] != (pointer)local_f0) {
      operator_delete(local_100[0],local_f0._0_8_ + 1);
    }
  }
  pRVar6 = (this->m_compiled_game).late_rules.
           super__Vector_base<CompiledGame::Rule,_std::allocator<CompiledGame::Rule>_>._M_impl.
           super__Vector_impl_data._M_start;
  pRVar2 = (this->m_compiled_game).late_rules.
           super__Vector_base<CompiledGame::Rule,_std::allocator<CompiledGame::Rule>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pRVar6 != pRVar2) {
    do {
      if ((int)(this->m_config).log_verbosity < 3) {
        peVar1 = (this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_1a8[0] = &local_198;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,m_engine_log_cat_abi_cxx11_._M_dataplus._M_p,
                   m_engine_log_cat_abi_cxx11_._M_dataplus._M_p +
                   m_engine_log_cat_abi_cxx11_._M_string_length);
        CompiledGame::Rule::to_string_abi_cxx11_((string *)local_1e8,pRVar6,false);
        plVar3 = (long *)std::__cxx11::string::replace((ulong)local_1e8,0,(char *)0x0,0x14ba9e);
        pMVar5 = (pointer)(plVar3 + 2);
        if ((pointer)*plVar3 == pMVar5) {
          local_1b8._0_8_ = pMVar5->origin;
          local_1b8._8_4_ = (undefined4)plVar3[3];
          local_1b8._12_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
          local_1c8 = (pointer)local_1b8;
        }
        else {
          local_1b8._0_8_ = pMVar5->origin;
          local_1c8 = (pointer)*plVar3;
        }
        local_1c0 = plVar3[1];
        *plVar3 = (long)pMVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        (*peVar1->_vptr_PSLogger[2])(peVar1,2,local_1a8,&local_1c8);
        if (local_1c8 != (pointer)local_1b8) {
          operator_delete(local_1c8,local_1b8._0_8_ + 1);
        }
        if ((pointer)local_1e8._0_8_ != (pointer)(local_1e8 + 0x10)) {
          operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
        }
        if (local_1a8[0] != &local_198) {
          operator_delete(local_1a8[0],
                          (ulong)&(local_198.cells.
                                   super__Vector_base<CompiledGame::CellRule,_std::allocator<CompiledGame::CellRule>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->field_0x1);
        }
      }
      apply_rule(this,pRVar6);
      pRVar6 = pRVar6 + 1;
    } while (pRVar6 != pRVar2);
  }
  if ((int)(this->m_config).log_verbosity < 3) {
    peVar1 = (this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_140._M_allocated_capacity = (size_type)local_130;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_140,m_engine_log_cat_abi_cxx11_._M_dataplus._M_p,
               m_engine_log_cat_abi_cxx11_._M_dataplus._M_p +
               m_engine_log_cat_abi_cxx11_._M_string_length);
    ObjectCache::to_string_abi_cxx11_(&local_a0,local_148);
    (*peVar1->_vptr_PSLogger[2])(peVar1,2,&local_140,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_140._M_allocated_capacity != local_130) {
      operator_delete((void *)local_140._M_allocated_capacity,local_130[0] + 1);
    }
  }
  std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::~vector(&local_70);
  return true;
}

Assistant:

bool PSEngine::next_subturn()
{
    PS_LOG("--- Subturn start ---");
    Level last_subturn_save = m_current_level;

    m_turn_history.subturns.push_back(SubturnHistory());

    m_object_cache.build_cache(m_current_level);

    for(const auto& rule : m_compiled_game.rules)
    {
        PS_LOG("Processing rule : " + rule.to_string());
        apply_rule(rule);
    }

    if( !resolve_movements() )
    {
        //todo : for now, movement should always successfully resolve
        //need to decide what to do and add in the history if a movement phase can be considered as unresolved
        //(ie: in puzzlescript there's an option to cancel the whole turn if the player cannot move for example)
        assert(false);
        /*PS_LOG("could not resolve movement, cancelling the turn.");
        m_current_level = last_subturn_save;
        m_turn_history.pop_back();*/
        return false;
    }
    else
    {
        PS_LOG("movement resolved");

        for(const auto& rule : m_compiled_game.late_rules)
        {
            PS_LOG("Processing late rule : " + rule.to_string());
            apply_rule(rule);
        }

        PS_LOG(m_object_cache.to_string());

        return true;
    }
}